

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptexnumber.cpp
# Opt level: O2

string * usage(string *__return_storage_ptr__,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::operator+(&local_50,"Usage: ",name);
  std::operator+(&local_30,&local_50,
                 " <pattern> <replacement> [ignore_comments ON(default)/OFF] [log_file]\n\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string usage(const std::string& name) {
    std::string result;
    result += "Usage: " + name +
              " <pattern> <replacement> [ignore_comments ON(default)/OFF] "
              "[log_file]\n\n";
    result += "Renumbers LaTeX equations. "
              "The program reads from the standard input and writes to the "
              "standard output.\n";
    result += "Warnings and errors are output to the standard error stream.";
    return result;
}